

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall
HighsSparseMatrix::priceByColumn
          (HighsSparseMatrix *this,bool quad_precision,HVector *result,HVector *column,
          HighsInt debug_report)

{
  double dVar1;
  int iVar2;
  const_reference pvVar3;
  vector<double,_std::allocator<double>_> *this_00;
  const_reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  long in_RCX;
  long in_RDX;
  byte in_SIL;
  long in_RDI;
  int in_R8D;
  HighsInt iEl_1;
  HighsInt iEl;
  HighsCDouble quad_value;
  double value;
  HighsInt iCol;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  HighsCDouble *in_stack_ffffffffffffff80;
  int local_48;
  int local_44;
  HighsCDouble local_40;
  double local_30;
  int local_28;
  long local_20;
  long local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  if (-2 < in_R8D) {
    printf("\nHighsSparseMatrix::priceByColumn:\n");
  }
  *(undefined4 *)(local_18 + 4) = 0;
  for (local_28 = 0; local_28 < *(int *)(in_RDI + 4); local_28 = local_28 + 1) {
    local_30 = 0.0;
    if ((local_9 & 1) == 0) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)local_28);
      for (local_48 = *pvVar3;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),
                              (long)(local_28 + 1)), local_48 < *pvVar3; local_48 = local_48 + 1) {
        in_stack_ffffffffffffff80 = (HighsCDouble *)(local_20 + 0x20);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_48);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff80,
                            (long)*pvVar3);
        dVar1 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),
                            (long)local_48);
        local_30 = dVar1 * *pvVar4 + local_30;
      }
    }
    else {
      HighsCDouble::HighsCDouble(&local_40,0.0);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)local_28);
      for (local_44 = *pvVar3;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),
                              (long)(local_28 + 1)), local_44 < *pvVar3; local_44 = local_44 + 1) {
        this_00 = (vector<double,_std::allocator<double>_> *)(local_20 + 0x20);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_44);
        std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)*pvVar3);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),(long)local_44);
        HighsCDouble::operator+=
                  (in_stack_ffffffffffffff80,
                   (double)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      }
      local_30 = HighsCDouble::operator_cast_to_double(&local_40);
    }
    dVar1 = local_30;
    if (1e-14 < ABS(local_30)) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0x20),
                          (long)local_28);
      *pvVar5 = dVar1;
      iVar2 = *(int *)(local_18 + 4);
      *(int *)(local_18 + 4) = iVar2 + 1;
      in_stack_ffffffffffffff7c = local_28;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_18 + 8),(long)iVar2);
      *pvVar6 = in_stack_ffffffffffffff7c;
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::priceByColumn(const bool quad_precision,
                                      HVector& result, const HVector& column,
                                      const HighsInt debug_report) const {
  assert(this->isColwise());
  if (debug_report >= kDebugReportAll)
    printf("\nHighsSparseMatrix::priceByColumn:\n");
  result.count = 0;
  for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
    double value = 0;
    if (quad_precision) {
      HighsCDouble quad_value = 0.0;
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++)
        quad_value += column.array[this->index_[iEl]] * this->value_[iEl];
      value = (double)quad_value;
    } else {
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++)
        value += column.array[this->index_[iEl]] * this->value_[iEl];
    }
    if (fabs(value) > kHighsTiny) {
      result.array[iCol] = value;
      result.index[result.count++] = iCol;
    }
  }
}